

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O3

void Tests::AddInstructionEvaluionFail(char *reason)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = instructionEvaluionFails;
  uVar5 = (ulong)instructionEvaluionFails;
  if (uVar5 != 0) {
    lVar4 = 0;
    do {
      iVar2 = strcmp(*(char **)((long)&instructionEvaluionFailInfo + lVar4),reason);
      if (iVar2 == 0) {
        *(int *)((long)&DAT_003ed6c8 + lVar4) = *(int *)((long)&DAT_003ed6c8 + lVar4) + 1;
        return;
      }
      lVar4 = lVar4 + 0x10;
    } while (uVar5 << 4 != lVar4);
    if (0x7f < uVar1) {
      __assert_fail("instructionEvaluionFails < 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/TestBase.cpp"
                    ,0xec,"void Tests::AddInstructionEvaluionFail(const char *)");
    }
  }
  pcVar3 = strdup(reason);
  (&instructionEvaluionFailInfo)[uVar5 * 2] = pcVar3;
  (&DAT_003ed6c8)[uVar5 * 4] = 1;
  instructionEvaluionFails = uVar1 + 1;
  return;
}

Assistant:

void AddInstructionEvaluionFail(const char *reason)
	{
		for(unsigned i = 0; i < instructionEvaluionFails; i++)
		{
			if(strcmp(instructionEvaluionFailInfo[i].reason, reason) == 0)
			{
				instructionEvaluionFailInfo[i].count++;
				return;
			}
		}
		assert(instructionEvaluionFails < 128);

		if(instructionEvaluionFails < 128)
		{
			instructionEvaluionFailInfo[instructionEvaluionFails].reason = strdup(reason);
			instructionEvaluionFailInfo[instructionEvaluionFails].count = 1;
			instructionEvaluionFails++;
		}
	}